

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckCloseFailureBecauseOfExceptionIncludesCheckContents::RunImpl
          (TestCheckCloseFailureBecauseOfExceptionIncludesCheckContents *this)

{
  TestResults *pTVar1;
  bool bVar2;
  int iVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  char *pcVar6;
  TestDetails local_928 [2];
  TestDetails local_8e8 [2];
  TestDetails local_8a8;
  float local_884;
  float local_880;
  float local_87c;
  undefined1 local_878 [8];
  ScopedCurrentTest scopedResults;
  undefined1 local_858 [8];
  TestResults testResults;
  RecordingReporter reporter;
  TestCheckCloseFailureBecauseOfExceptionIncludesCheckContents *this_local;
  
  reporter._2088_8_ = this;
  RecordingReporter::RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  UnitTest::TestResults::TestResults
            ((TestResults *)local_858,(TestReporter *)&testResults.m_failureCount);
  ScopedCurrentTest::ScopedCurrentTest
            ((ScopedCurrentTest *)local_878,(TestResults *)local_858,(TestDetails *)0x0);
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar4;
  iVar3 = ThrowingFunction();
  local_87c = (float)iVar3;
  local_880 = 1.0001;
  local_884 = 0.1;
  ppTVar5 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8a8,*ppTVar5,300);
  UnitTest::CheckClose<float,float,float>(pTVar1,&local_87c,&local_880,&local_884,&local_8a8);
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)local_878);
  pcVar6 = strstr(reporter.lastFailedTest + 0xf8,"(float)ThrowingFunction()");
  bVar2 = UnitTest::Check<char*>(pcVar6);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_8e8,*ppTVar5,0x12f);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_8e8,"strstr(reporter.lastFailedMessage, \"(float)ThrowingFunction()\")")
    ;
  }
  pcVar6 = strstr(reporter.lastFailedTest + 0xf8,"1.0001f");
  bVar2 = UnitTest::Check<char*>(pcVar6);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_928,*ppTVar5,0x130);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_928,"strstr(reporter.lastFailedMessage, \"1.0001f\")");
  }
  RecordingReporter::~RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  return;
}

Assistant:

TEST(CheckCloseFailureBecauseOfExceptionIncludesCheckContents)
{
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);
        CHECK_CLOSE ((float)ThrowingFunction(), 1.0001f, 0.1f);
    }

    CHECK(strstr(reporter.lastFailedMessage, "(float)ThrowingFunction()"));
    CHECK(strstr(reporter.lastFailedMessage, "1.0001f"));
}